

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

void ** __thiscall llvm::SmallPtrSetImplBase::find_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  bool bVar1;
  void **Bucket;
  void **E;
  void **APtr;
  void *Ptr_local;
  SmallPtrSetImplBase *this_local;
  
  bVar1 = isSmall(this);
  if (bVar1) {
    for (E = this->SmallArray; E != this->SmallArray + this->NumNonEmpty; E = E + 1) {
      if (*E == Ptr) {
        return E;
      }
    }
    this_local = (SmallPtrSetImplBase *)EndPointer(this);
  }
  else {
    this_local = (SmallPtrSetImplBase *)FindBucketFor(this,Ptr);
    if (this_local->SmallArray != (void **)Ptr) {
      this_local = (SmallPtrSetImplBase *)EndPointer(this);
    }
  }
  return &this_local->SmallArray;
}

Assistant:

const void *const * find_imp(const void * Ptr) const {
    if (isSmall()) {
      // Linear search for the item.
      for (const void *const *APtr = SmallArray,
                      *const *E = SmallArray + NumNonEmpty; APtr != E; ++APtr)
        if (*APtr == Ptr)
          return APtr;
      return EndPointer();
    }

    // Big set case.
    auto *Bucket = FindBucketFor(Ptr);
    if (*Bucket == Ptr)
      return Bucket;
    return EndPointer();
  }